

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BuiltInVariableGroup::init
          (BuiltInVariableGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  VertexIDCase *this_00;
  BuiltInVariableGroup *this_local;
  
  this_00 = (VertexIDCase *)operator_new(0x98);
  VertexIDCase::VertexIDCase(this_00,(this->super_TestCaseGroup).m_context,this->m_method);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void BuiltInVariableGroup::init (void)
{
	addChild(new VertexIDCase(m_context, m_method));
}